

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlReaderForFd(int fd,char *URL,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input_00;
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr reader;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlTextReaderPtr pxStack_10;
  int fd_local;
  
  if (fd < 0) {
    pxStack_10 = (xmlTextReaderPtr)0x0;
  }
  else {
    input_00 = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      pxStack_10 = (xmlTextReaderPtr)0x0;
    }
    else {
      input_00->closecallback = (xmlInputCloseCallback)0x0;
      pxStack_10 = xmlNewTextReader(input_00,URL);
      if (pxStack_10 == (xmlTextReaderPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        pxStack_10 = (xmlTextReaderPtr)0x0;
      }
      else {
        pxStack_10->allocs = pxStack_10->allocs | 1;
        iVar1 = xmlTextReaderSetup(pxStack_10,(xmlParserInputBufferPtr)0x0,URL,encoding,options);
        if (iVar1 < 0) {
          xmlFreeTextReader(pxStack_10);
          pxStack_10 = (xmlTextReaderPtr)0x0;
        }
      }
    }
  }
  return pxStack_10;
}

Assistant:

xmlTextReaderPtr
xmlReaderForFd(int fd, const char *URL, const char *encoding, int options)
{
    xmlTextReaderPtr reader;
    xmlParserInputBufferPtr input;

    if (fd < 0)
        return (NULL);

    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (NULL);
    input->closecallback = NULL;
    reader = xmlNewTextReader(input, URL);
    if (reader == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    reader->allocs |= XML_TEXTREADER_INPUT;
    if (xmlTextReaderSetup(reader, NULL, URL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}